

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O3

int flikam(double *P,int MP,double *Q,int MQ,double *W,double *E,int N,double *ssq,double *fact,
          double *VW,double *VL,int MRP1,double *VK,int MR,double TOLER)

{
  int MXPQ;
  int iVar1;
  int iVar2;
  ulong uVar3;
  double *pdVar4;
  uint b;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  double *pdVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  int local_6c;
  double local_40;
  uint local_38;
  
  uVar3 = (ulong)(uint)MP;
  *fact = 0.0;
  *ssq = 0.0;
  MXPQ = imax(MP,MQ);
  b = MQ + 1;
  iVar1 = twacf(P,MP,Q,MQ,VW,MXPQ + 1,VL,MXPQ + 1,VK,MXPQ);
  iVar2 = imax(MP,b);
  iVar12 = 6;
  if (iVar2 == MR) {
    iVar12 = iVar1;
  }
  local_6c = 7;
  if (MR + 1U == MRP1) {
    local_6c = iVar12;
  }
  if (0 < local_6c) {
    return local_6c;
  }
  uVar5 = MP + 1;
  dVar21 = *VW;
  *VK = dVar21;
  if (MR == 1) {
    VL[(ulong)(uint)MR - 1] = 0.0;
    uVar11 = 0;
  }
  else {
    if (MR < 2) {
      VL[(long)MR + -1] = 0.0;
      goto LAB_00118aa5;
    }
    lVar10 = (ulong)uVar5 - 2;
    uVar7 = 2;
    lVar8 = 1;
    pdVar4 = P;
    do {
      pdVar4 = pdVar4 + 1;
      VK[uVar7 - 1] = 0.0;
      dVar21 = 0.0;
      if ((long)uVar7 <= (long)MP) {
        lVar6 = 0;
        do {
          dVar21 = dVar21 + pdVar4[lVar6] * VW[lVar6 + 1];
          VK[uVar7 - 1] = dVar21;
          lVar6 = lVar6 + 1;
        } while (lVar10 != lVar6);
      }
      lVar6 = lVar8;
      pdVar9 = VL;
      if ((long)uVar7 <= (long)(int)b) {
        do {
          dVar21 = dVar21 - Q[lVar6 + -1] * *pdVar9;
          VK[uVar7 - 1] = dVar21;
          lVar6 = lVar6 + 1;
          pdVar9 = pdVar9 + 1;
        } while (lVar6 <= MQ);
      }
      uVar7 = uVar7 + 1;
      lVar10 = lVar10 + -1;
      lVar8 = lVar8 + 1;
    } while (uVar7 != MR + 1U);
    dVar21 = *VK;
    uVar11 = MR - 1;
    VL[(long)MR + -1] = 0.0;
  }
  uVar7 = 0;
  do {
    VW[uVar7] = 0.0;
    if (uVar11 != uVar7) {
      VL[uVar7] = VK[uVar7 + 1];
    }
    if ((long)uVar7 < (long)MP) {
      dVar15 = P[uVar7] * dVar21 + VL[uVar7];
      VL[uVar7] = dVar15;
    }
    else {
      dVar15 = VL[uVar7];
    }
    VK[uVar7] = dVar15;
    uVar7 = uVar7 + 1;
  } while ((uint)MR != uVar7);
LAB_00118aa5:
  VW[MP] = 0.0;
  VL[MXPQ] = 0.0;
  if (N < 1) {
    local_6c = 9;
  }
  else {
    uVar7 = (ulong)(N + 1);
    uVar13 = 1;
    dVar15 = 1.0;
    local_40 = 0.0;
    local_38 = uVar5;
    do {
      if (uVar13 == uVar5 - MQ) {
        local_38 = imin(MP,MQ);
        uVar14 = (ulong)(uVar5 - MQ);
        if (0 < MQ) {
          uVar3 = (ulong)local_38;
          local_38 = local_38 + 1;
          goto LAB_00118bc8;
        }
LAB_00118ece:
        iVar12 = (int)uVar13;
        local_6c = -iVar12;
        uVar3 = uVar14;
        if (iVar12 <= N) {
          do {
            E[uVar3 - 1] = W[uVar3 - 1];
            uVar3 = uVar3 + 1;
          } while (uVar7 != uVar3);
          if (MP != 0 && iVar12 <= N) {
            pdVar4 = W + (uVar14 - 2);
            uVar3 = uVar14;
            do {
              if (0 < MP) {
                dVar21 = E[uVar3 - 1];
                lVar8 = 0;
                pdVar9 = P;
                do {
                  dVar21 = dVar21 - *pdVar9 * pdVar4[lVar8];
                  E[uVar3 - 1] = dVar21;
                  pdVar9 = pdVar9 + 1;
                  lVar8 = lVar8 + -1;
                } while (1 - (ulong)uVar5 != lVar8);
              }
              uVar3 = uVar3 + 1;
              pdVar4 = pdVar4 + 1;
            } while (uVar3 != uVar7);
          }
          if (MQ != 0 && iVar12 <= N) {
            pdVar4 = E + (uVar14 - 2);
            uVar3 = uVar14;
            do {
              if (0 < MQ) {
                dVar21 = E[uVar3 - 1];
                lVar8 = 0;
                pdVar9 = Q;
                do {
                  dVar21 = dVar21 + *pdVar9 * pdVar4[lVar8];
                  E[uVar3 - 1] = dVar21;
                  pdVar9 = pdVar9 + 1;
                  lVar8 = lVar8 + -1;
                } while (1 - (ulong)b != lVar8);
              }
              uVar3 = uVar3 + 1;
              pdVar4 = pdVar4 + 1;
            } while (uVar3 != uVar7);
          }
          if (iVar12 <= N) {
            dVar21 = *ssq;
            do {
              dVar21 = dVar21 + E[uVar14 - 1] * E[uVar14 - 1];
              *ssq = dVar21;
              uVar14 = uVar14 + 1;
            } while (uVar7 != uVar14);
          }
        }
        break;
      }
LAB_00118bc8:
      if (dVar21 <= 1e-10) {
        return 8;
      }
      if (((long)MXPQ < (long)uVar13) && (uVar14 = uVar13, ABS(dVar21 + -1.0) < TOLER))
      goto LAB_00118ece;
      for (dVar15 = dVar15 * dVar21; dVar16 = ABS(dVar15), 1.0 <= dVar16; dVar15 = dVar15 * 0.0625)
      {
        local_40 = local_40 + 4.0;
      }
      while (dVar16 < 0.0625) {
        dVar15 = dVar15 * 16.0;
        local_40 = local_40 + -4.0;
        dVar16 = ABS(dVar15);
      }
      dVar16 = *VW;
      dVar19 = W[uVar13 - 1];
      if (dVar21 < 0.0) {
        dVar17 = sqrt(dVar21);
      }
      else {
        dVar17 = SQRT(dVar21);
      }
      dVar19 = dVar19 - dVar16;
      E[uVar13 - 1] = dVar19 / dVar17;
      dVar18 = dVar19 / dVar21;
      *ssq = dVar19 * dVar18 + *ssq;
      dVar19 = *VL;
      dVar17 = -dVar19 / dVar21;
      if (0 < (int)uVar3) {
        uVar14 = 0;
        do {
          dVar20 = P[uVar14] * dVar19 + VL[uVar14 + 1];
          VW[uVar14] = VK[uVar14] * dVar18 + P[uVar14] * dVar16 + VW[uVar14 + 1];
          VL[uVar14] = VK[uVar14] * dVar17 + dVar20;
          VK[uVar14] = dVar20 * dVar17 + VK[uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar3 != uVar14);
      }
      if ((int)local_38 <= MQ) {
        lVar8 = (long)(int)local_38;
        lVar10 = 0;
        do {
          VW[lVar8 + lVar10 + -1] = VK[lVar8 + lVar10 + -1] * dVar18 + VW[lVar8 + lVar10];
          VL[lVar8 + lVar10 + -1] = VK[lVar8 + lVar10 + -1] * dVar17 + VL[lVar8 + lVar10];
          VK[lVar8 + lVar10 + -1] = VL[lVar8 + lVar10] * dVar17 + VK[lVar8 + lVar10 + -1];
          lVar10 = lVar10 + 1;
        } while (b - local_38 != (int)lVar10);
      }
      if ((int)local_38 <= MP) {
        lVar8 = (long)(int)local_38;
        lVar10 = 0;
        do {
          VW[lVar8 + lVar10 + -1] = P[lVar8 + lVar10 + -1] * W[uVar13 - 1] + VW[lVar8 + lVar10];
          lVar10 = lVar10 + 1;
        } while (uVar5 - local_38 != (int)lVar10);
      }
      dVar21 = dVar21 + dVar17 * dVar19;
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar7);
    dVar21 = pow(dVar15,1.0 / (double)N);
    dVar15 = exp2(local_40 / (double)N);
    *fact = dVar15 * dVar21;
  }
  return local_6c;
}

Assistant:

int flikam(double *P, int MP, double *Q, int MQ,double *W, double *E, int N,double *ssq,double *fact,double *VW,double *VL,int MRP1,double *VK,int MR,double TOLER) {
	int ifault,MXPQ,MXPQP1,MQP1,MPP1,FLAG;
	int k,j,jp2mk,jp1mk,LAST,LOOP,JFROM,i,NEXTI,imj;
	double zero, p0625, one, two, four, sixteen,epsil1;
	double A, ALF, AOR, DETCAR, DETMAN, FLJ, R, VL1, VW1;

	zero = 0.0; p0625 = 0.0625; one = 1.0; two = 2.0; four = 4.0; sixteen = 16.0;
	epsil1 = 1.0e-10;

	*ssq = *fact = zero;
	DETMAN = one;
	DETCAR = zero;
	MXPQ = imax(MP, MQ);// Check
	MXPQP1 = MXPQ + 1;
	MQP1 = MQ + 1;
	MPP1 = MP + 1;
	FLAG = 0;

	ifault = twacf(P, MP,Q, MQ,VW,MXPQP1,VL, MXPQP1,VK,MXPQ);
	if (MR != imax(MP, MQP1)) {
		ifault = 6;
	}
	if (MRP1 != MR + 1) {
		ifault = 7;
	}

	if (ifault > 0) {
		return ifault;
	}

	VK[0] = VW[0];

	if (MR != 1) {
		for (k = 2; k <= MR; ++k) {
			VK[k - 1] = zero;
			if (k <= MP) {
				for (j = k; j <= MP; ++j) {
					jp2mk = j + 2 - k;
					VK[k - 1] += P[j - 1] * VW[jp2mk - 1];
				}
			}//120
			if (k <= MQP1) {
				for (j = k; j <= MQP1; ++j) {
					jp1mk = j + 1 - k;
					VK[k - 1] -= Q[j - 2] * VL[jp1mk - 1];
				}
			}
		}
	}//150

	R = VK[0];
	VL[MR - 1] = zero;
	for (j = 0; j < MR; ++j) {
		VW[j] = zero;
		if (j != MR - 1) {
			VL[j] = VK[j + 1];
		}
		if (j <= MP - 1) {
			VL[j] += P[j] * R;
		}
		VK[j] = VL[j];
	}

	LAST = MPP1 - MQ;
	LOOP = MP;
	JFROM = MPP1;
	VW[MPP1-1] = zero;
	VL[MXPQP1-1] = zero;

	if (N <= 0) {
		return 9;
	}

	for (i = 1; i <= N; ++i) {
		if (i == LAST) {
			LOOP = imin(MP, MQ);
			JFROM = LOOP + 1;
			if (MQ <= 0) {
				FLAG = 1;
				break;
			}
		}
		if (R <= epsil1) {
			return 8;
		}
		if (fabs(R - one) < TOLER && i > MXPQ) {
			FLAG = 1;
			break;
		}
		DETMAN *= R;
		while (fabs(DETMAN) >= one) {
			DETMAN *= p0625;
			DETCAR += four;
		}
		while (fabs(DETMAN) < p0625) {
			DETMAN *= sixteen;
			DETCAR -= four;
		}
		VW1 = VW[0];
		A = W[i - 1] - VW1;
		E[i - 1] = A / sqrt(R);
		AOR = A / R;
		*ssq += A*AOR;
		VL1 = VL[0];
		ALF = VL1 / R;
		R -= ALF * VL1;
		if (LOOP != 0) {
			for (j = 0; j < LOOP; ++j) {
				FLJ = VL[j + 1] + P[j] * VL1;
				VW[j] = VW[j + 1] + P[j] * VW1 + AOR * VK[j];
				VL[j] = FLJ - ALF * VK[j];
				VK[j] -= ALF * FLJ;
			}
		}

		if (JFROM <= MQ) {
			for (j = JFROM; j <= MQ; ++j) {
				VW[j - 1] = VW[j] + AOR * VK[j - 1];
				VL[j - 1] = VL[j] - ALF * VK[j - 1];
				VK[j - 1] -= ALF*VL[j];
			}
		}
		if (JFROM <= MP) {
			for (j = JFROM; j <= MP; ++j) {
				VW[j - 1] = VW[j] + P[j-1] * W[i-1];
			}
		}
	}

	if (FLAG == 1) {
		NEXTI = i;
		ifault = -NEXTI;
		for (i = NEXTI; i <= N; ++i) {
			E[i - 1] = W[i - 1];
		}
		if (MP != 0) {
			for (i = NEXTI; i <= N; ++i) {
				for (j = 1; j <= MP; ++j) {
					imj = i - j;
					E[i - 1] -= P[j - 1] * W[imj - 1];
				}
			}
		}//340
		if (MQ != 0) {
			for (i = NEXTI; i <= N; ++i) {
				for (j = 1; j <= MQ; ++j) {
					imj = i - j;
					E[i - 1] += Q[j - 1] * E[imj - 1];
				}
			}
		}
		for (i = NEXTI; i <= N; ++i) {
			*ssq += E[i - 1] * E[i - 1];
		}
	}
	/*
	mdisplay(VW, 1, MRP1);
	mdisplay(VL, 1, MRP1);
	mdisplay(VK, 1, MR);
	*/
	*fact = pow(DETMAN, one / (double)N) * pow(two, DETCAR / (double)N);

	return ifault;
}